

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aio.c
# Opt level: O2

void nni_aio_completions_add(nni_aio_completions *clp,nni_aio *aio,nng_err result,size_t count)

{
  int iVar1;
  
  iVar1 = nni_list_node_active(&aio->a_prov_node);
  if (iVar1 != 0) {
    nni_panic("%s: %d: assert err: %s",
              "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/core/aio.c",0x220
              ,"!nni_aio_list_active(aio)");
  }
  (aio->a_reap_node).rn_next = (nni_reap_node *)*clp;
  aio->a_result = result;
  aio->a_count = count;
  *clp = aio;
  return;
}

Assistant:

void
nni_aio_completions_add(
    nni_aio_completions *clp, nni_aio *aio, nng_err result, size_t count)
{
	NNI_ASSERT(!nni_aio_list_active(aio));
	aio->a_reap_node.rn_next = *clp;
	aio->a_result            = result;
	aio->a_count             = count;
	*clp                     = aio;
}